

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O0

void __thiscall
libtorrent::session_handle::
async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>
          (session_handle *this,offset_in_session_impl_to_subr f,
          strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a,peer_class_info *a_1)

{
  bool bVar1;
  element_type *this_00;
  io_context *ctx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_R8;
  undefined1 local_c8 [32];
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> local_a8;
  peer_class_info local_a0;
  error_code_enum local_54;
  undefined1 local_50 [8];
  shared_ptr<libtorrent::aux::session_impl> s;
  peer_class_info *a_local_1;
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a_local;
  offset_in_session_impl_to_subr f_local;
  session_handle *this_local;
  
  s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_R8;
  ::std::weak_ptr<libtorrent::aux::session_impl>::lock
            ((weak_ptr<libtorrent::aux::session_impl> *)local_50);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_50);
  if (!bVar1) {
    local_54 = invalid_session_handle;
    libtorrent::aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              (&local_54);
  }
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
  ctx = libtorrent::aux::session_impl::get_context(this_00);
  ::std::shared_ptr<libtorrent::aux::session_impl>::shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_c8,
             (shared_ptr<libtorrent::aux::session_impl> *)local_50);
  local_a8.m_val = *(uint *)a_1;
  local_c8._16_8_ = f;
  local_c8._24_8_ = a;
  peer_class_info::peer_class_info
            (&local_a0,
             (peer_class_info *)
             s.super___shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::async_call<void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&>(void(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>,libtorrent::peer_class_info_const&),libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&,libtorrent::peer_class_info_const&)const::_lambda()_1_>
            (ctx,(type_conflict17 *)local_c8,(type *)0x0);
  const::{lambda()#1}::~async_call((_lambda___1_ *)local_c8);
  ::std::shared_ptr<libtorrent::aux::session_impl>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl> *)local_50);
  return;
}

Assistant:

void session_handle::async_call(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);
		dispatch(s->get_context(), [=]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				s->alerts().emplace_alert<session_error_alert>(e.code(), e.what());
			} catch (std::exception const& e) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), e.what());
			} catch (...) {
				s->alerts().emplace_alert<session_error_alert>(error_code(), "unknown error");
			}
#endif
		});
	}